

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenGlobalSet(BinaryenModuleRef module,char *name,BinaryenExpressionRef value)

{
  GlobalSet *pGVar1;
  string_view local_38;
  Builder local_28;
  
  local_28.wasm = module;
  wasm::Name::Name((Name *)&local_38,name);
  pGVar1 = wasm::Builder::makeGlobalSet(&local_28,(Name)local_38,value);
  return (BinaryenExpressionRef)pGVar1;
}

Assistant:

BinaryenExpressionRef BinaryenGlobalSet(BinaryenModuleRef module,
                                        const char* name,
                                        BinaryenExpressionRef value) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeGlobalSet(name, (Expression*)value));
}